

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::MultiDrawIndexed
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,MultiDrawIndexedAttribs *Attribs,
          int param_2)

{
  Uint32 *pUVar1;
  PRIMITIVE_TOPOLOGY Topology;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  Uint32 UVar4;
  GraphicsPipelineDesc *pGVar5;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char *in_R8;
  char (*in_R9) [8];
  long lVar6;
  Uint32 i;
  ulong uVar7;
  PipelineStateGLImpl *pPVar8;
  string msg;
  String local_48;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  if ((Attribs->Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != DRAW_FLAG_NONE) {
    CVar2 = (this->m_Desc).QueueType;
    if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
      if ((this->m_Desc).IsDeferred == false) {
        FormatString<char[79]>
                  (&msg,(char (*) [79])
                        "Queue type may never be unknown for immediate contexts. This looks like a bug."
                  );
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"MultiDrawIndexed",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                   ,0x992);
        std::__cxx11::string::~string((string *)&msg);
      }
      FormatString<char[97]>
                (&msg,(char (*) [97])
                      "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
                );
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x992);
      std::__cxx11::string::~string((string *)&msg);
      CVar2 = (this->m_Desc).QueueType;
      Type = extraout_DL;
    }
    if ((~CVar2 & 7) != 0) {
      GetCommandQueueTypeString_abi_cxx11_(&local_48,(Diligent *)(ulong)CVar2,Type);
      in_R8 = " queue.";
      FormatString<char[17],char[22],std::__cxx11::string,char[8]>
                (&msg,(Diligent *)"MultiDrawIndexed",(char (*) [17])0x7e8bba,
                 (char (*) [22])&local_48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",
                 in_R9);
      std::__cxx11::string::~string((string *)&local_48);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x992);
      std::__cxx11::string::~string((string *)&msg);
    }
    pPVar8 = (this->m_pPipelineState).m_pObject;
    if (pPVar8 == (PipelineStateGLImpl *)0x0) {
      FormatString<char[76]>
                (&msg,(char (*) [76])
                      "MultiDrawIndexed command arguments are invalid: no pipeline state is bound.")
      ;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x994);
      std::__cxx11::string::~string((string *)&msg);
      pPVar8 = (this->m_pPipelineState).m_pObject;
    }
    PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
              (&pPVar8->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    if ((pPVar8->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
        super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
        .m_Desc.PipelineType != PIPELINE_TYPE_GRAPHICS) {
      pPVar8 = (this->m_pPipelineState).m_pObject;
      PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
                (&pPVar8->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
      FormatString<char[65],char_const*,char[30]>
                (&msg,(Diligent *)
                      "MultiDrawIndexed command arguments are invalid: pipeline state \'",
                 (char (*) [65])
                 &(pPVar8->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                  .m_Desc,(char **)"\' is not a graphics pipeline.",(char (*) [30])in_R8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x998);
      std::__cxx11::string::~string((string *)&msg);
    }
    if ((this->m_pIndexBuffer).m_pObject == (BufferGLImpl *)0x0) {
      FormatString<char[74]>
                (&msg,(char (*) [74])
                      "MultiDrawIndexed command arguments are invalid: no index buffer is bound.");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x99a);
      std::__cxx11::string::~string((string *)&msg);
    }
    bVar3 = VerifyMultiDrawIndexedAttribs(Attribs);
    if (!bVar3) {
      FormatString<char[36]>(&msg,(char (*) [36])"MultiDrawIndexedAttribs are invalid");
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"MultiDrawIndexed",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x99c);
      std::__cxx11::string::~string((string *)&msg);
    }
  }
  pPVar8 = (this->m_pPipelineState).m_pObject;
  if (pPVar8 != (PipelineStateGLImpl *)0x0) {
    pGVar5 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                       (&pPVar8->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
    Topology = pGVar5->PrimitiveTopology;
    lVar6 = 0;
    for (uVar7 = 0; uVar7 < Attribs->DrawCount; uVar7 = uVar7 + 1) {
      UVar4 = GetPrimitiveCount(Topology,*(Uint32 *)((long)&Attribs->pDrawItems->NumIndices + lVar6)
                               );
      pUVar1 = (this->m_Stats).PrimitiveCounts + Topology;
      *pUVar1 = *pUVar1 + UVar4;
      lVar6 = lVar6 + 0xc;
    }
  }
  if (this->m_NativeMultiDrawSupported == false) {
    UVar4 = Attribs->DrawCount;
  }
  else {
    UVar4 = 1;
  }
  pUVar1 = &(this->m_Stats).CommandCounters.DrawIndexed +
           (ulong)this->m_NativeMultiDrawSupported * 4;
  *pUVar1 = *pUVar1 + UVar4;
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::MultiDrawIndexed(const MultiDrawIndexedAttribs& Attribs, int)
{
#ifdef DILIGENT_DEVELOPMENT
    if ((Attribs.Flags & DRAW_FLAG_VERIFY_DRAW_ATTRIBS) != 0)
    {
        DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "MultiDrawIndexed");

        DEV_CHECK_ERR(m_pPipelineState, "MultiDrawIndexed command arguments are invalid: no pipeline state is bound.");

        DEV_CHECK_ERR(m_pPipelineState->GetDesc().PipelineType == PIPELINE_TYPE_GRAPHICS,
                      "MultiDrawIndexed command arguments are invalid: pipeline state '",
                      m_pPipelineState->GetDesc().Name, "' is not a graphics pipeline.");

        DEV_CHECK_ERR(m_pIndexBuffer, "MultiDrawIndexed command arguments are invalid: no index buffer is bound.");

        DEV_CHECK_ERR(VerifyMultiDrawIndexedAttribs(Attribs), "MultiDrawIndexedAttribs are invalid");
    }
#endif
    if (m_pPipelineState)
    {
        const PRIMITIVE_TOPOLOGY Topology = m_pPipelineState->GetGraphicsPipelineDesc().PrimitiveTopology;
        for (Uint32 i = 0; i < Attribs.DrawCount; ++i)
            m_Stats.PrimitiveCounts[Topology] += GetPrimitiveCount(Topology, Attribs.pDrawItems[i].NumIndices);
    }
    if (m_NativeMultiDrawSupported)
        ++m_Stats.CommandCounters.MultiDrawIndexed;
    else
        m_Stats.CommandCounters.DrawIndexed += Attribs.DrawCount;
}